

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

void * yang_read_deviate_unsupported(lys_deviation *dev)

{
  lys_deviate *plVar1;
  LY_ERR *pLVar2;
  lys_deviation *dev_local;
  
  if (dev->deviate_size == '\0') {
    plVar1 = (lys_deviate *)calloc(1,0x48);
    dev->deviate = plVar1;
    if (dev->deviate == (lys_deviate *)0x0) {
      pLVar2 = ly_errno_location();
      *pLVar2 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_deviate_unsupported");
      dev_local = (lys_deviation *)0x0;
    }
    else {
      dev->deviate[dev->deviate_size].mod = LY_DEVIATE_NO;
      dev->deviate_size = '\x01';
      dev_local = (lys_deviation *)dev->deviate;
    }
  }
  else {
    ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
            "\"not-supported\" deviation cannot be combined with any other deviation.");
    dev_local = (lys_deviation *)0x0;
  }
  return dev_local;
}

Assistant:

void *
yang_read_deviate_unsupported(struct lys_deviation *dev)
{
    if (dev->deviate_size) {
        LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "\"not-supported\" deviation cannot be combined with any other deviation.");
        return NULL;
    }
    dev->deviate = calloc(1, sizeof *dev->deviate);
    if (!dev->deviate) {
        LOGMEM;
        return NULL;
    }
    dev->deviate[dev->deviate_size].mod = LY_DEVIATE_NO;
    dev->deviate_size = 1;
    return dev->deviate;
}